

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

string * kiste::parse_parent_class(string *__return_storage_ptr__,string *line)

{
  char *pcVar1;
  parse_error *ppVar2;
  long lVar3;
  size_type nameEnd;
  size_type nameBegin;
  allocator<char> local_21;
  long local_20;
  size_type colonPos;
  string *line_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_name;
  
  colonPos = (size_type)line;
  line_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_first_not_of((char *)line,0x1120de);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[](colonPos);
    if (*pcVar1 != ':') {
      ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error
                (ppVar2,"Unexpected character after class name, did you forget a \':\'?");
      __cxa_throw(ppVar2,&parse_error::typeinfo,parse_error::~parse_error);
    }
    lVar3 = std::__cxx11::string::find_first_not_of((char *)colonPos,0x1120de);
    if (lVar3 == -1) {
      ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
      parse_error::parse_error(ppVar2,"Could not find parent class name");
      __cxa_throw(ppVar2,&parse_error::typeinfo,parse_error::~parse_error);
    }
    lVar3 = std::__cxx11::string::find_first_of((char *)colonPos,0x1120de);
    if (lVar3 == -1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,colonPos);
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,colonPos);
      lVar3 = std::__cxx11::string::find_first_not_of((char *)colonPos,0x1120de);
      if (lVar3 != -1) {
        ppVar2 = (parse_error *)__cxa_allocate_exception(0x10);
        parse_error::parse_error(ppVar2,"Unexpected trailing characters after parent class name");
        __cxa_throw(ppVar2,&parse_error::typeinfo,parse_error::~parse_error);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse_parent_class(const std::string& line) -> std::string
  {
    const auto colonPos = line.find_first_not_of(" \t");
    if (colonPos == line.npos)
    {
      return "";
    }
    if (line[colonPos] != ':')
    {
      throw parse_error("Unexpected character after class name, did you forget a ':'?");
    }
    const auto nameBegin = line.find_first_not_of(" \t", colonPos + 1);
    if (nameBegin == line.npos)
    {
      throw parse_error("Could not find parent class name");
    }
    const auto nameEnd = line.find_first_of(" \t", nameBegin);
    const auto parent_name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                                    : line.substr(nameBegin, nameEnd - nameBegin);

    if (nameEnd != line.npos and line.find_first_not_of(" \t", nameEnd) != line.npos)
    {
      throw parse_error("Unexpected trailing characters after parent class name");
    }

    return parent_name;
  }